

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecAssignment(Parser *this)

{
  pointer pcVar1;
  CompileContext *pCVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Parser *in_RSI;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> expr;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> rightExpr;
  Token oper;
  undefined1 local_90 [16];
  TokenType local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  line_t local_58;
  col_t local_54;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  parsePrecLogicalOr((Parser *)local_90);
  if ((in_RSI->m_current).type == EQUAL) {
    advance(in_RSI);
    local_80 = (in_RSI->m_previous).type;
    pcVar1 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + (in_RSI->m_previous).lexeme._M_string_length);
    local_54 = (in_RSI->m_previous).col;
    local_58 = (in_RSI->m_previous).line;
    parsePrecAssignment((Parser *)(local_90 + 8));
    pCVar2 = (CompileContext *)operator_new(0x48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity == &local_68) {
      local_38._8_8_ = local_68._8_8_;
      local_48._M_p = (pointer)&local_38;
    }
    else {
      local_48._M_p = (pointer)local_78._M_allocated_capacity;
    }
    local_38._M_allocated_capacity._1_7_ = local_68._1_7_;
    local_38._M_local_buf[0] = local_68._M_local_buf[0];
    (pCVar2->m_source)._M_dataplus._M_p = (pointer)&PTR__AssignExpr_00129510;
    (pCVar2->m_source)._M_string_length = local_90._0_8_;
    (pCVar2->m_source).field_2._M_allocated_capacity = local_90._8_8_;
    *(TokenType *)((long)&(pCVar2->m_source).field_2 + 8) = local_80;
    paVar3 = &(pCVar2->m_options).m_filename.field_2;
    (pCVar2->m_options).m_filename._M_dataplus._M_p = (pointer)paVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p == &local_38) {
      paVar3->_M_allocated_capacity = local_38._M_allocated_capacity;
      *(undefined8 *)((long)&(pCVar2->m_options).m_filename.field_2 + 8) = local_38._8_8_;
    }
    else {
      (pCVar2->m_options).m_filename._M_dataplus._M_p = local_48._M_p;
      (pCVar2->m_options).m_filename.field_2._M_allocated_capacity = local_38._M_allocated_capacity;
    }
    (pCVar2->m_options).m_filename._M_string_length = local_78._8_8_;
    *(col_t *)((long)&(pCVar2->m_options).m_programArgs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 4) = local_54;
    *(line_t *)
     &(pCVar2->m_options).m_programArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_58;
    this->m_context = pCVar2;
  }
  else {
    this->m_context = (CompileContext *)local_90._0_8_;
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecAssignment() {
        std::unique_ptr<Expr> expr = parsePrecLogicalOr();

        if (consume(TokenType::EQUAL)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> rightExpr = parsePrecAssignment(); // Right-associative
            return std::make_unique<AssignExpr>(std::move(expr), std::move(rightExpr), std::move(oper));
        }

        return expr;
    }